

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  long in_stack_00000028;
  int j;
  int i;
  float *sptr;
  int v;
  int u;
  float *ptr;
  Mat img;
  int p;
  int gap;
  Mat bottom_im2col;
  int maxk;
  int size;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m_1;
  Mat *m;
  Option *in_stack_00002aa8;
  Mat *in_stack_00002ab0;
  Mat *in_stack_00002ab8;
  Mat *in_stack_00002ac0;
  Mat *in_stack_00002ac8;
  undefined8 in_stack_fffffffffffffc50;
  void **ppvVar1;
  size_t in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  Mat *in_stack_fffffffffffffc70;
  int local_358;
  int local_354;
  undefined4 *local_350;
  int local_348;
  int local_344;
  undefined8 local_340;
  undefined8 local_338;
  Allocator *in_stack_fffffffffffffcd0;
  undefined4 *local_2f8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined4 local_2c8;
  long local_2c0;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined8 local_2a0;
  int local_298;
  int local_294;
  void *local_290;
  int *local_288;
  long local_280;
  undefined4 local_278;
  long *local_270;
  undefined4 local_268;
  int local_264;
  int local_260;
  undefined4 local_25c;
  undefined4 local_258;
  long local_250;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  long *local_210;
  undefined8 *local_208;
  undefined8 *local_1f8;
  void **local_1e8;
  int local_1c8;
  undefined4 local_1c4;
  void **local_1c0;
  undefined8 *local_1a0;
  undefined8 *local_180;
  undefined1 local_175;
  int local_174;
  void **local_170;
  undefined8 *local_168;
  undefined8 *local_148;
  undefined1 local_13d;
  int local_13c;
  undefined8 *local_130;
  void *local_e0;
  undefined8 local_d0;
  undefined4 local_c4;
  undefined8 local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  void **local_a8;
  int local_9c;
  undefined8 *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  long local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  long *local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 *local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_234 = *(int *)((long)in_RDI + 0x2c);
  local_238 = (int)in_RDI[7];
  local_23c = *(int *)(in_RSI + 0x2c);
  local_240 = *(int *)(in_RSI + 0x30);
  local_244 = local_23c * local_240;
  local_248 = in_R8D * in_R9D;
  local_d0 = *(undefined8 *)(in_stack_00000028 + 0x10);
  local_a8 = &local_290;
  local_c0 = 4;
  local_c4 = 1;
  local_290 = (void *)0x0;
  local_288 = (int *)0x0;
  local_280 = 0;
  local_278 = 0;
  local_270 = (long *)0x0;
  local_268 = 0;
  local_264 = 0;
  local_260 = 0;
  local_25c = 0;
  local_258 = 0;
  local_250 = 0;
  local_230 = in_R9D;
  local_22c = in_R8D;
  local_210 = in_RDI;
  local_b4 = local_238;
  local_b0 = local_248;
  local_ac = local_244;
  Mat::create(in_stack_fffffffffffffc70,(int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
              (int)in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20),
              in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
              in_stack_fffffffffffffcd0);
  local_294 = local_234 * in_stack_00000020 - local_23c * in_stack_00000018;
  for (local_298 = 0; local_298 < local_238; local_298 = local_298 + 1) {
    local_130 = &local_2e0;
    local_64 = *(int *)((long)local_210 + 0x2c);
    local_68 = (int)local_210[6];
    local_6c = *(undefined4 *)((long)local_210 + 0x34);
    local_78 = *local_210 + local_210[8] * (long)local_298 * local_210[2];
    local_80 = local_210[2];
    local_84 = (undefined4)local_210[3];
    local_90 = local_210[4];
    local_60 = &local_2e0;
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_168 = &local_340;
    local_170 = &local_290;
    local_40 = (undefined4 *)((long)local_290 + local_250 * local_298 * local_280);
    local_28 = &local_340;
    local_18 = (long)local_264 * (long)local_260 * local_280;
    local_148 = &local_340;
    local_208 = &local_340;
    local_340 = 0;
    local_338 = 0;
    local_2f8 = local_40;
    for (local_344 = 0; local_344 < local_230; local_344 = local_344 + 1) {
      for (local_348 = 0; local_348 < local_22c; local_348 = local_348 + 1) {
        local_9c = in_stack_00000010 * local_344;
        local_98 = &local_2e0;
        local_350 = (undefined4 *)
                    (local_78 + (long)local_64 * (long)local_9c * local_80 +
                    (long)(in_stack_00000008 * local_348) * 4);
        for (local_354 = 0; local_354 < local_240; local_354 = local_354 + 1) {
          for (local_358 = 0; local_358 < local_23c; local_358 = local_358 + 1) {
            *local_2f8 = *local_350;
            local_350 = local_350 + in_stack_00000018;
            local_2f8 = local_2f8 + 1;
          }
          local_350 = local_350 + local_294;
        }
      }
    }
    local_1f8 = &local_2e0;
    local_c = 0x10;
    local_1c = 0x10;
    local_2c = local_264;
    local_30 = local_260;
    local_34 = local_25c;
    local_48 = local_280;
    local_4c = local_278;
    local_58 = local_270;
    local_13c = local_298;
    local_13d = 1;
    local_174 = local_298;
    local_175 = 1;
    local_2e0 = 0;
    local_2d0 = 0;
    local_2c8 = 0;
    local_2b8 = 0;
    local_2b4 = 0;
    local_2b0 = 0;
    local_2ac = 0;
    local_2a8 = 0;
    local_2a0 = 0;
    local_2d8 = 0;
    local_1a0 = local_1f8;
    local_180 = local_208;
    local_2c0 = local_90;
  }
  im2col_sgemm_sse(in_stack_00002ac8,in_stack_00002ac0,in_stack_00002ab8,in_stack_00002ab0,
                   in_stack_00002aa8);
  ppvVar1 = &local_290;
  if (local_288 != (int *)0x0) {
    local_1c4 = 0xffffffff;
    LOCK();
    local_1c8 = *local_288;
    *local_288 = *local_288 + -1;
    UNLOCK();
    if (local_1c8 == 1) {
      local_1e8 = ppvVar1;
      local_1c0 = ppvVar1;
      if (local_270 == (long *)0x0) {
        local_e0 = local_290;
        if (local_290 != (void *)0x0) {
          free(local_290);
        }
      }
      else {
        (**(code **)(*local_270 + 0x18))(local_270,local_290);
      }
    }
  }
  *ppvVar1 = (void *)0x0;
  ppvVar1[2] = (void *)0x0;
  *(undefined4 *)(ppvVar1 + 3) = 0;
  *(undefined4 *)(ppvVar1 + 5) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
  *(undefined4 *)(ppvVar1 + 6) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
  *(undefined4 *)(ppvVar1 + 7) = 0;
  ppvVar1[8] = (void *)0x0;
  ppvVar1[1] = (void *)0x0;
  return;
}

Assistant:

static void convolution_im2col_sgemm_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    const int size = outw * outh;

    const int maxk = kernel_w * kernel_h;

    // im2col
    Mat bottom_im2col(size, maxk, inch, 4u, 1, opt.workspace_allocator);
    {
        const int gap = w * stride_h - outw * stride_w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < inch; p++)
        {
            const Mat img = bottom_blob.channel(p);
            float* ptr = bottom_im2col.channel(p);

            for (int u = 0; u < kernel_h; u++)
            {
                for (int v = 0; v < kernel_w; v++)
                {
                    const float* sptr = img.row<const float>(dilation_h * u) + dilation_w * v;

                    for (int i = 0; i < outh; i++)
                    {
                        int j = 0;
                        for (; j < outw; j++)
                        {
                            ptr[0] = sptr[0];

                            sptr += stride_w;
                            ptr += 1;
                        }

                        sptr += gap;
                    }
                }
            }
        }
    }

    im2col_sgemm_sse(bottom_im2col, top_blob, kernel, _bias, opt);
}